

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O0

void google::protobuf::internal::ReflectionOps::FindInitializationErrors
               (Message *message,string *prefix,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *errors)

{
  int iVar1;
  long *plVar2;
  Descriptor *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__lhs;
  bool bVar3;
  int iVar4;
  CppType CVar5;
  FieldDescriptor *pFVar6;
  ulong uVar7;
  string *psVar8;
  size_type sVar9;
  reference ppFVar10;
  Message *pMVar11;
  string local_e8;
  Message *local_c8;
  Message *sub_message_1;
  Message *local_a0;
  Message *sub_message;
  int j;
  int size;
  FieldDescriptor *field;
  undefined1 local_80 [4];
  int i_1;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  int local_34;
  long *plStack_30;
  int i;
  Reflection *reflection;
  Descriptor *descriptor;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *errors_local;
  string *prefix_local;
  Message *message_local;
  
  descriptor = (Descriptor *)errors;
  errors_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)prefix;
  prefix_local = (string *)message;
  reflection = (Reflection *)Message::GetDescriptor(message);
  plStack_30 = (long *)(**(code **)(*(long *)prefix_local + 0xb0))();
  for (local_34 = 0; iVar1 = local_34, iVar4 = Descriptor::field_count((Descriptor *)reflection),
      iVar1 < iVar4; local_34 = local_34 + 1) {
    pFVar6 = Descriptor::field((Descriptor *)reflection,local_34);
    bVar3 = FieldDescriptor::is_required(pFVar6);
    psVar8 = prefix_local;
    plVar2 = plStack_30;
    if (bVar3) {
      pFVar6 = Descriptor::field((Descriptor *)reflection,local_34);
      uVar7 = (**(code **)(*plVar2 + 0x28))(plVar2,psVar8,pFVar6);
      __lhs = errors_local;
      this = descriptor;
      if ((uVar7 & 1) == 0) {
        pFVar6 = Descriptor::field((Descriptor *)reflection,local_34);
        psVar8 = FieldDescriptor::name_abi_cxx11_(pFVar6);
        std::operator+(&local_58,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                       psVar8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this,&local_58);
        std::__cxx11::string::~string((string *)&local_58);
      }
    }
  }
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)local_80);
  (**(code **)(*plStack_30 + 0x80))
            (plStack_30,prefix_local,
             (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)local_80);
  for (field._4_4_ = 0; uVar7 = (ulong)field._4_4_,
      sVar9 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::size((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      *)local_80), uVar7 < sVar9; field._4_4_ = field._4_4_ + 1) {
    ppFVar10 = std::
               vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ::operator[]((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                             *)local_80,(long)field._4_4_);
    _j = *ppFVar10;
    CVar5 = FieldDescriptor::cpp_type(_j);
    if (CVar5 == CPPTYPE_MESSAGE) {
      bVar3 = FieldDescriptor::is_repeated(_j);
      if (bVar3) {
        sub_message._4_4_ = (**(code **)(*plStack_30 + 0x30))(plStack_30,prefix_local,_j);
        for (sub_message._0_4_ = 0; (int)sub_message < sub_message._4_4_;
            sub_message._0_4_ = (int)sub_message + 1) {
          pMVar11 = (Message *)
                    (**(code **)(*plStack_30 + 0x1a0))(plStack_30,prefix_local,_j,(int)sub_message);
          local_a0 = pMVar11;
          SubMessagePrefix((string *)&sub_message_1,(string *)errors_local,_j,(int)sub_message);
          FindInitializationErrors
                    (pMVar11,(string *)&sub_message_1,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)descriptor);
          std::__cxx11::string::~string((string *)&sub_message_1);
        }
      }
      else {
        pMVar11 = (Message *)(**(code **)(*plStack_30 + 0xd8))(plStack_30,prefix_local,_j,0);
        local_c8 = pMVar11;
        SubMessagePrefix(&local_e8,(string *)errors_local,_j,-1);
        FindInitializationErrors
                  (pMVar11,&local_e8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)descriptor);
        std::__cxx11::string::~string((string *)&local_e8);
      }
    }
  }
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             *)local_80);
  return;
}

Assistant:

void ReflectionOps::FindInitializationErrors(
    const Message& message,
    const string& prefix,
    std::vector<string>* errors) {
  const Descriptor* descriptor = message.GetDescriptor();
  const Reflection* reflection = message.GetReflection();

  // Check required fields of this message.
  for (int i = 0; i < descriptor->field_count(); i++) {
    if (descriptor->field(i)->is_required()) {
      if (!reflection->HasField(message, descriptor->field(i))) {
        errors->push_back(prefix + descriptor->field(i)->name());
      }
    }
  }

  // Check sub-messages.
  std::vector<const FieldDescriptor*> fields;
  reflection->ListFields(message, &fields);
  for (int i = 0; i < fields.size(); i++) {
    const FieldDescriptor* field = fields[i];
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {

      if (field->is_repeated()) {
        int size = reflection->FieldSize(message, field);

        for (int j = 0; j < size; j++) {
          const Message& sub_message =
            reflection->GetRepeatedMessage(message, field, j);
          FindInitializationErrors(sub_message,
                                   SubMessagePrefix(prefix, field, j),
                                   errors);
        }
      } else {
        const Message& sub_message = reflection->GetMessage(message, field);
        FindInitializationErrors(sub_message,
                                 SubMessagePrefix(prefix, field, -1),
                                 errors);
      }
    }
  }
}